

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void __thiscall chatra::Thread::processSwitchCase(Thread *this,bool enter)

{
  pointer pFVar1;
  ulong uVar2;
  pointer psVar3;
  pointer psVar4;
  Node *pNVar5;
  Node *pNVar6;
  pointer psVar7;
  pointer psVar8;
  undefined7 in_register_00000031;
  long lVar9;
  long lVar10;
  
  if ((int)CONCAT71(in_register_00000031,enter) == 0) {
    pop(this);
    return;
  }
  pFVar1 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pNVar5 = pFVar1[-1].node;
  while (pNVar6 = pFVar1[-2].node,
        (pNVar5->blockNodes).
        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pNVar5->blockNodes).
        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
    uVar2 = pFVar1[-2].phase;
    psVar3 = (pNVar6->blockNodes).
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pNVar6->blockNodes).
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <= uVar2)
    break;
    checkIsValidNode(this,psVar3[uVar2].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
    pNVar5 = psVar3[uVar2].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (1 < (byte)(pNVar5->type - Case)) {
      pNVar6 = pFVar1[-2].node;
      break;
    }
    pFVar1[-1].node = pNVar5;
    pFVar1[-2].phase = pFVar1[-2].phase + 1;
  }
  pFVar1[-1].phase = 0;
  psVar3 = (pNVar6->blockNodes).
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (pNVar6->blockNodes).
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)psVar4 - (long)psVar3;
  psVar8 = psVar3;
  for (lVar10 = lVar9 >> 6; psVar7 = psVar8, 0 < lVar10; lVar10 = lVar10 + -1) {
    if ((((psVar8->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
        ~ScriptRoot) == Catch) goto LAB_00160c2c;
    if (((psVar8[1].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
        ~ScriptRoot) == Catch) {
      psVar7 = psVar8 + 1;
      goto LAB_00160c2c;
    }
    if (((psVar8[2].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
        ~ScriptRoot) == Catch) {
      psVar7 = psVar8 + 2;
      goto LAB_00160c2c;
    }
    if (((psVar8[3].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
        ~ScriptRoot) == Catch) {
      psVar7 = psVar8 + 3;
      goto LAB_00160c2c;
    }
    psVar8 = psVar8 + 4;
    lVar9 = lVar9 + -0x40;
  }
  lVar9 = lVar9 >> 4;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      psVar7 = psVar4;
      if ((lVar9 != 3) ||
         (psVar7 = psVar8,
         (((psVar8->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
         ~ScriptRoot) == Catch)) goto LAB_00160c2c;
      psVar7 = psVar8 + 1;
    }
    if ((((psVar7->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
        ~ScriptRoot) == Catch) goto LAB_00160c2c;
    psVar8 = psVar7 + 1;
  }
  psVar7 = psVar4;
  if ((((psVar8->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
      ~ScriptRoot) == Catch) {
    psVar7 = psVar8;
  }
LAB_00160c2c:
  pFVar1[-2].phase = (long)psVar7 - (long)psVar3 >> 4;
  return;
}

Assistant:

void Thread::processSwitchCase(bool enter) {
	if (!enter) {
		pop();
		return;
	}

	auto& f0 = *(frames.end() - 1);
	auto& f1 = *(frames.end() - 2);

	while (f0.node->blockNodes.empty() && f1.phase < f1.node->blockNodes.size()) {
		auto& nextNode = f1.node->blockNodes[f1.phase];
		checkIsValidNode(nextNode.get());
		if (nextNode->type != NodeType::Case && nextNode->type != NodeType::Default)
			break;
		f0.node = nextNode.get();
		f1.phase++;
	}

	f0.phase = 0;
	f1.phase = static_cast<size_t>(std::distance(f1.node->blockNodes.cbegin(),
			std::find_if(f1.node->blockNodes.cbegin(), f1.node->blockNodes.cend(), [](const std::shared_ptr<Node>& n) {
				return n->type == NodeType::Catch || n->type == NodeType::Finally;
			})));
}